

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>::
DeviceObjectBase(DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>
                 *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                SamplerDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  RenderDeviceVkImpl *pRVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILTER_TYPE FVar5;
  FILTER_TYPE FVar6;
  FILTER_TYPE FVar7;
  TEXTURE_ADDRESS_MODE TVar8;
  TEXTURE_ADDRESS_MODE TVar9;
  TEXTURE_ADDRESS_MODE TVar10;
  SAMPLER_FLAGS SVar11;
  Bool BVar12;
  Float32 FVar13;
  Uint32 UVar14;
  COMPARISON_FUNCTION CVar15;
  undefined3 uVar16;
  Float32 FVar17;
  undefined4 uVar18;
  int iVar19;
  size_t sVar20;
  IMemoryAllocator *pIVar21;
  char *pcVar22;
  undefined4 extraout_var_00;
  SamplerDesc *Args_1;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::ISamplerVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::ISamplerVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::ISamplerVk>).super_RefCountedObject<Diligent::ISamplerVk>.
  super_ISamplerVk.super_ISampler.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00b00390;
  this->m_pDevice = pDevice;
  FVar5 = ObjDesc->MinFilter;
  FVar6 = ObjDesc->MagFilter;
  FVar7 = ObjDesc->MipFilter;
  TVar8 = ObjDesc->AddressU;
  TVar9 = ObjDesc->AddressV;
  TVar10 = ObjDesc->AddressW;
  SVar11 = ObjDesc->Flags;
  BVar12 = ObjDesc->UnnormalizedCoords;
  FVar13 = ObjDesc->MipLODBias;
  UVar14 = ObjDesc->MaxAnisotropy;
  CVar15 = ObjDesc->ComparisonFunc;
  uVar16 = *(undefined3 *)&ObjDesc->field_0x19;
  FVar17 = ObjDesc->BorderColor[0];
  uVar3 = *(undefined8 *)(ObjDesc->BorderColor + 1);
  uVar4 = *(undefined8 *)(ObjDesc->BorderColor + 3);
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).MinFilter = FVar5;
  (this->m_Desc).MagFilter = FVar6;
  (this->m_Desc).MipFilter = FVar7;
  (this->m_Desc).AddressU = TVar8;
  (this->m_Desc).AddressV = TVar9;
  (this->m_Desc).AddressW = TVar10;
  (this->m_Desc).Flags = SVar11;
  (this->m_Desc).UnnormalizedCoords = BVar12;
  (this->m_Desc).MipLODBias = FVar13;
  (this->m_Desc).MaxAnisotropy = UVar14;
  (this->m_Desc).ComparisonFunc = CVar15;
  *(undefined3 *)&(this->m_Desc).field_0x19 = uVar16;
  (this->m_Desc).BorderColor[0] = FVar17;
  *(undefined8 *)((this->m_Desc).BorderColor + 1) = uVar3;
  *(undefined8 *)((this->m_Desc).BorderColor + 3) = uVar4;
  uVar18 = *(undefined4 *)&ObjDesc->field_0x34;
  (this->m_Desc).MaxLOD = ObjDesc->MaxLOD;
  *(undefined4 *)&(this->m_Desc).field_0x34 = uVar18;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar19 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar19 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar19 = iVar19 + 1;
  }
  this->m_UniqueID = iVar19;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    if (this->m_pDevice == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (SamplerDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pRVar2 = this->m_pDevice;
    if ((pRVar2->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
        super_ObjectBase<Diligent::IRenderDeviceVk>.
        super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters == (RefCountersImpl *)0x0)
    {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pRVar2->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
               super_ObjectBase<Diligent::IRenderDeviceVk>.
               super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters);
  }
  pcVar22 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar22 == (char *)0x0) {
    pIVar21 = GetStringAllocator();
    iVar19 = (**pIVar21->_vptr_IMemoryAllocator)
                       (pIVar21,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar22 = (char *)CONCAT44(extraout_var_00,iVar19);
    snprintf(pcVar22,0x13,"0x%llX",this);
  }
  else {
    sVar20 = strlen(pcVar22);
    pIVar21 = GetStringAllocator();
    iVar19 = (**pIVar21->_vptr_IMemoryAllocator)
                       (pIVar21,sVar20 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar22 = (char *)CONCAT44(extraout_var,iVar19);
    memcpy(pcVar22,(ObjDesc->super_DeviceObjectAttribs).Name,sVar20 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar22;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }